

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::PerAEADTest_CleanupAfterInitFailure_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::PerAEADTest_CleanupAfterInitFailure_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<(anonymous_namespace)::KnownAEAD>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  anon_unknown.dwarf_18ac8a::PerAEADTest::PerAEADTest((PerAEADTest *)this_00);
  (((TestWithParam<(anonymous_namespace)::KnownAEAD> *)&this_00->_vptr_Test)->super_Test)._vptr_Test
       = (_func_int **)&PTR__TestWithParam_0067a190;
  this_00[1]._vptr_Test = (_func_int **)&PTR__PerAEADTest_CleanupAfterInitFailure_Test_0067a1d0;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }